

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

int Abc_NtkAddBuffsEval(Abc_Obj_t *pNode,Abc_Obj_t *pFanin)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pFanin_local;
  Abc_Obj_t *pNode_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Abc_ObjFanoutNum(pFanin);
    if (iVar1 <= local_2c) {
      return 1;
    }
    pAVar2 = Abc_ObjFanout(pFanin,local_2c);
    if ((pAVar2 != pNode) &&
       (*(uint *)&pNode->field_0x14 >> 0xc <= *(uint *)&pAVar2->field_0x14 >> 0xc)) break;
    local_2c = local_2c + 1;
  }
  return 0;
}

Assistant:

int Abc_NtkAddBuffsEval( Abc_Obj_t * pNode, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pFanin, pFanout, i )
        if ( pFanout != pNode && pFanout->Level >= pNode->Level )
            return 0;
    return 1;
}